

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDress2.c
# Opt level: O1

void Abc_NtkDress2(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,int nConflictLimit,int fVerbose)

{
  void **ppvVar1;
  void *__ptr;
  int iVar2;
  int iVar3;
  Vec_Ptr_t *vRes;
  long lVar4;
  long lVar5;
  timespec ts;
  timespec local_40;
  
  iVar2 = clock_gettime(3,&local_40);
  if (iVar2 < 0) {
    lVar5 = 1;
  }
  else {
    lVar5 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar5 = ((lVar5 >> 7) - (lVar5 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  vRes = Abc_NtkDressComputeEquivs(pNtk1,pNtk2,nConflictLimit,fVerbose);
  iVar2 = pNtk1->nObjCounts[7];
  iVar3 = clock_gettime(3,&local_40);
  if (iVar3 < 0) {
    lVar4 = -1;
  }
  else {
    lVar4 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  Abc_NtkDressPrintStats(vRes,iVar2,iVar2,lVar4 + lVar5);
  Abc_NtkDress2Transfer(pNtk1,pNtk2,vRes,fVerbose);
  iVar2 = vRes->nSize;
  if (0 < (long)iVar2) {
    ppvVar1 = vRes->pArray;
    lVar5 = 0;
    do {
      __ptr = ppvVar1[lVar5];
      if (__ptr != (void *)0x0) {
        if (*(void **)((long)__ptr + 8) != (void *)0x0) {
          free(*(void **)((long)__ptr + 8));
          *(undefined8 *)((long)__ptr + 8) = 0;
        }
        free(__ptr);
      }
      lVar5 = lVar5 + 1;
    } while (iVar2 != lVar5);
  }
  if (vRes->pArray != (void **)0x0) {
    free(vRes->pArray);
    vRes->pArray = (void **)0x0;
  }
  if (vRes != (Vec_Ptr_t *)0x0) {
    free(vRes);
  }
  return;
}

Assistant:

void Abc_NtkDress2( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int nConflictLimit, int fVerbose )
{
    Vec_Ptr_t * vRes;
    abctime clk = Abc_Clock();
    vRes = Abc_NtkDressComputeEquivs( pNtk1, pNtk2, nConflictLimit, fVerbose );
//    Abc_NtkDressPrintEquivs( vRes );
    Abc_NtkDressPrintStats( vRes, Abc_NtkNodeNum(pNtk1), Abc_NtkNodeNum(pNtk1), Abc_Clock() - clk );
    Abc_NtkDress2Transfer( pNtk1, pNtk2, vRes, fVerbose );
    Vec_VecFree( (Vec_Vec_t *)vRes );
}